

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_5x5_int8.h
# Opt level: O0

void ncnn::conv5x5s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_R9;
  int stride_h;
  int stride_w;
  int kernel_h;
  int kernel_w;
  int in_stack_000007f4;
  int in_stack_000007f8;
  int in_stack_000007fc;
  Mat *in_stack_00000800;
  Mat *in_stack_00000808;
  Mat *in_stack_00000810;
  int in_stack_00000820;
  Mat *in_stack_00000828;
  vector<float,_std::allocator<float>_> *in_stack_00000830;
  Option *in_stack_00000838;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x500000005,in_RDX);
  conv_im2col_sgemm_int8_requant_sse
            (in_stack_00000810,in_stack_00000808,in_stack_00000800,in_stack_000007fc,
             in_stack_000007f8,in_stack_000007f4,in_stack_00000820,in_stack_00000828,
             in_stack_00000830,in_stack_00000838);
  std::vector<float,_std::allocator<float>_>::~vector(in_R9);
  return;
}

Assistant:

static void conv5x5s2_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int kernel_w = 5;
    int kernel_h = 5;

    int stride_w = 2;
    int stride_h = 2;

    conv_im2col_sgemm_int8_requant_sse(bottom_blob, top_blob, _kernel, kernel_w, kernel_h, stride_w, stride_h, _bias, scales_requant, opt);
}